

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

QSize __thiscall QAbstractSpinBox::sizeHint(QAbstractSpinBox *this)

{
  bool bVar1;
  QAbstractSpinBoxPrivate *this_00;
  int *piVar2;
  qsizetype qVar3;
  QStyle *pQVar4;
  QSize QVar5;
  QStringBuilder<const_QString_&,_const_QString_&> *in_RDI;
  long in_FS_OFFSET;
  int h;
  QAbstractSpinBoxPrivate *d;
  QSize hint;
  QString fixedContent;
  QString s;
  int w;
  QFontMetrics fm;
  QStyleOptionSpinBox opt;
  QWidget *in_stack_fffffffffffffea8;
  QWidget *in_stack_fffffffffffffed8;
  int local_120;
  int local_11c;
  undefined1 local_118 [28];
  int local_fc;
  undefined1 local_f8 [30];
  undefined2 local_da;
  QStringBuilder<const_QString_&,_const_QString_&> local_d8;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  QString local_b0;
  int local_94;
  undefined8 local_90;
  undefined1 *local_88;
  QSize local_80;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractSpinBox *)0x687b90);
  bVar1 = QSize::isEmpty((QSize *)this_00);
  if (bVar1) {
    QWidget::ensurePolished(in_stack_fffffffffffffed8);
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics(in_stack_fffffffffffffea8);
    local_90 = (**(code **)(*(long *)&this_00->edit->super_QWidget + 0x70))();
    QSize::height((QSize *)0x687c01);
    local_94 = 0;
    local_b0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b0.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_b0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x687c4a);
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = ::operator+((QString *)in_RDI,(QString *)in_stack_fffffffffffffea8);
    local_da = 0x20;
    ::operator+(in_RDI,(char16_t *)in_stack_fffffffffffffea8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<const_QString_&,_const_QString_&>,_char16_t> *)
               in_stack_fffffffffffffea8);
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xd8))
              (local_f8,this_00,&this_00->minimum);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffea8);
    QString::~QString((QString *)0x687d15);
    QString::truncate((longlong)&local_b0);
    QString::operator+=((QString *)in_RDI,(QString *)in_stack_fffffffffffffea8);
    local_fc = QFontMetrics::horizontalAdvance((QString *)&local_88,(int)&local_b0);
    piVar2 = qMax<int>(&local_94,&local_fc);
    local_94 = *piVar2;
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xd8))
              (local_118,this_00,&this_00->maximum);
    QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffea8);
    QString::~QString((QString *)0x687db0);
    QString::truncate((longlong)&local_b0);
    QString::operator+=((QString *)in_RDI,(QString *)in_stack_fffffffffffffea8);
    local_11c = QFontMetrics::horizontalAdvance((QString *)&local_88,(int)&local_b0);
    piVar2 = qMax<int>(&local_94,&local_11c);
    local_94 = *piVar2;
    qVar3 = QString::size(&this_00->specialValueText);
    if (qVar3 != 0) {
      QString::operator=(&local_b0,(QString *)&this_00->specialValueText);
      local_120 = QFontMetrics::horizontalAdvance((QString *)&local_88,(int)&local_b0);
      piVar2 = qMax<int>(&local_94,&local_120);
      local_94 = *piVar2;
    }
    local_94 = local_94 + 2;
    memset(local_78,0xaa,0x58);
    QStyleOptionSpinBox::QStyleOptionSpinBox((QStyleOptionSpinBox *)0x687eae);
    (*(code *)in_RDI->a[0x12].d.size)(in_RDI,local_78);
    QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 (int)in_stack_fffffffffffffea8);
    pQVar4 = QWidget::style(in_stack_fffffffffffffea8);
    QVar5 = (QSize)(**(code **)(*(long *)pQVar4 + 0xe8))
                             (pQVar4,0xf,local_78,&stack0xfffffffffffffed8,in_RDI);
    this_00->cachedSizeHint = QVar5;
    QStyleOptionSpinBox::~QStyleOptionSpinBox((QStyleOptionSpinBox *)0x687f35);
    QString::~QString((QString *)0x687f42);
    QString::~QString((QString *)0x687f4f);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_88);
  }
  local_80 = this_00->cachedSizeHint;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_80;
}

Assistant:

QSize QAbstractSpinBox::sizeHint() const
{
    Q_D(const QAbstractSpinBox);
    if (d->cachedSizeHint.isEmpty()) {
        ensurePolished();

        const QFontMetrics fm(fontMetrics());
        int h = d->edit->sizeHint().height();
        int w = 0;
        QString s;
        QString fixedContent =  d->prefix + d->suffix + u' ';
        s = d->textFromValue(d->minimum);
        s.truncate(18);
        s += fixedContent;
        w = qMax(w, fm.horizontalAdvance(s));
        s = d->textFromValue(d->maximum);
        s.truncate(18);
        s += fixedContent;
        w = qMax(w, fm.horizontalAdvance(s));

        if (d->specialValueText.size()) {
            s = d->specialValueText;
            w = qMax(w, fm.horizontalAdvance(s));
        }
        w += 2; // cursor blinking space

        QStyleOptionSpinBox opt;
        initStyleOption(&opt);
        QSize hint(w, h);
        d->cachedSizeHint = style()->sizeFromContents(QStyle::CT_SpinBox, &opt, hint, this);
    }
    return d->cachedSizeHint;
}